

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O3

void uv_pipe_connect(uv_connect_t *req,uv_pipe_t *handle,char *name,uv_connect_cb cb)

{
  int iVar1;
  uv_loop_t *puVar2;
  long *plVar3;
  int iVar4;
  int *piVar5;
  sockaddr local_9e [6];
  undefined1 local_31;
  
  iVar1 = (handle->io_watcher).fd;
  if (iVar1 == -1) {
    iVar4 = uv__socket(1,1,0);
    if (iVar4 < 0) goto LAB_0010d17a;
    (handle->io_watcher).fd = iVar4;
  }
  strncpy(local_9e[0].sa_data,name,0x6b);
  local_31 = 0;
  local_9e[0].sa_family = 1;
  do {
    iVar4 = connect((handle->io_watcher).fd,local_9e,0x6e);
    if (iVar4 != -1) goto LAB_0010d136;
    piVar5 = __errno_location();
    iVar4 = *piVar5;
  } while (iVar4 == 4);
  if (iVar4 == 0x73) {
LAB_0010d136:
    if (iVar1 == -1) {
      iVar4 = uv__stream_open((uv_stream_t *)handle,(handle->io_watcher).fd,0x60);
      if (iVar4 != 0) goto LAB_0010d17a;
    }
    uv__io_start(handle->loop,&handle->io_watcher,5);
    iVar4 = 0;
  }
  else {
    iVar4 = -iVar4;
  }
LAB_0010d17a:
  handle->delayed_error = iVar4;
  handle->connect_req = req;
  puVar2 = handle->loop;
  req->type = UV_CONNECT;
  req->active_queue[0] = puVar2->active_reqs;
  plVar3 = (long *)puVar2->active_reqs[1];
  req->active_queue[1] = plVar3;
  *plVar3 = (long)req->active_queue;
  puVar2->active_reqs[1] = req->active_queue;
  req->handle = (uv_stream_t *)handle;
  req->cb = cb;
  req->queue[0] = req->queue;
  req->queue[1] = req->queue;
  if (iVar4 != 0) {
    uv__io_feed(handle->loop,&handle->io_watcher);
  }
  return;
}

Assistant:

void uv_pipe_connect(uv_connect_t* req,
                    uv_pipe_t* handle,
                    const char* name,
                    uv_connect_cb cb) {
  struct sockaddr_un saddr;
  int new_sock;
  int err;
  int r;

  new_sock = (uv__stream_fd(handle) == -1);
  err = -EINVAL;

  if (new_sock) {
    err = uv__socket(AF_UNIX, SOCK_STREAM, 0);
    if (err < 0)
      goto out;
    handle->io_watcher.fd = err;
  }

  memset(&saddr, 0, sizeof saddr);
  strncpy(saddr.sun_path, name, sizeof(saddr.sun_path) - 1);
  saddr.sun_path[sizeof(saddr.sun_path) - 1] = '\0';
  saddr.sun_family = AF_UNIX;

  do {
    r = connect(uv__stream_fd(handle),
                (struct sockaddr*)&saddr, sizeof saddr);
  }
  while (r == -1 && errno == EINTR);

  if (r == -1 && errno != EINPROGRESS) {
    err = -errno;
    goto out;
  }

  err = 0;
  if (new_sock) {
    err = uv__stream_open((uv_stream_t*)handle,
                          uv__stream_fd(handle),
                          UV_STREAM_READABLE | UV_STREAM_WRITABLE);
  }

  if (err == 0)
    uv__io_start(handle->loop, &handle->io_watcher, UV__POLLIN | UV__POLLOUT);

out:
  handle->delayed_error = err;
  handle->connect_req = req;

  uv__req_init(handle->loop, req, UV_CONNECT);
  req->handle = (uv_stream_t*)handle;
  req->cb = cb;
  QUEUE_INIT(&req->queue);

  /* Force callback to run on next tick in case of error. */
  if (err)
    uv__io_feed(handle->loop, &handle->io_watcher);

  /* Mimic the Windows pipe implementation, always
   * return 0 and let the callback handle errors.
   */
}